

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cpp
# Opt level: O0

void __thiscall DSDcc::CRC::generate_crc_table(CRC *this)

{
  ulong uVar1;
  CRC *in_RDI;
  unsigned_long crc;
  unsigned_long bit;
  int j;
  int i;
  unsigned_long local_20;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < 0x100; local_c = local_c + 1) {
    local_20 = (unsigned_long)local_c;
    if (in_RDI->m_refin != 0) {
      local_20 = reflect(in_RDI,local_20,8);
    }
    local_20 = local_20 << ((char)in_RDI->m_order - 8U & 0x3f);
    for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
      uVar1 = local_20 & in_RDI->m_crchighbit;
      local_20 = local_20 << 1;
      if (uVar1 != 0) {
        local_20 = in_RDI->m_poly ^ local_20;
      }
    }
    if (in_RDI->m_refin != 0) {
      local_20 = reflect(in_RDI,local_20,in_RDI->m_order);
    }
    in_RDI->m_crctab[local_c] = in_RDI->m_crcmask & local_20;
  }
  return;
}

Assistant:

void CRC::generate_crc_table()
{
    // make CRC lookup table used by table algorithms

    int i, j;
    unsigned long bit, crc;

    for (i = 0; i < 256; i++)
    {
        crc = (unsigned long) i;

        if (m_refin)
            crc = reflect(crc, 8);

        crc <<= m_order - 8;

        for (j = 0; j < 8; j++)
        {
            bit = crc & m_crchighbit;
            crc <<= 1;

            if (bit)
                crc ^= m_poly;
        }

        if (m_refin)
            crc = reflect(crc, m_order);
        crc &= m_crcmask;
        m_crctab[i] = crc;
    }
}